

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O2

void operator_attack(op_type_conflict *op_pt)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  
  dVar5 = op_pt->amp;
  dVar5 = ((op_pt->a3 * dVar5 + op_pt->a2) * dVar5 + op_pt->a1) * dVar5 + op_pt->a0;
  op_pt->amp = dVar5;
  uVar1 = op_pt->generator_pos >> 0x10;
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    uVar3 = op_pt->cur_env_step + 1;
    op_pt->cur_env_step = uVar3;
    if ((op_pt->env_step_a & uVar3) == 0) {
      if (1.0 < dVar5) {
        op_pt->op_state = 1;
        op_pt->amp = 1.0;
        op_pt->step_amp = 1.0;
        dVar5 = 1.0;
      }
      bVar2 = op_pt->step_skip_pos_a * '\x02';
      if (bVar2 < 2) {
        bVar2 = 1;
      }
      op_pt->step_skip_pos_a = bVar2;
      if ((bVar2 & (byte)op_pt->env_step_skip_a) != 0) {
        op_pt->step_amp = dVar5;
      }
    }
  }
  op_pt->generator_pos = op_pt->generator_pos & 0xffff;
  return;
}

Assistant:

static void operator_attack(op_type* op_pt)
{
	Bit32u num_steps_add;
	Bit32u ct;
	
	op_pt->amp = ((op_pt->a3*op_pt->amp + op_pt->a2)*op_pt->amp + op_pt->a1)*op_pt->amp + op_pt->a0;

	num_steps_add = op_pt->generator_pos/FIXEDPT;		// number of (standardized) samples
	for (ct=0; ct<num_steps_add; ct++)
	{
		op_pt->cur_env_step++;	// next sample
		if ((op_pt->cur_env_step & op_pt->env_step_a)==0)
		{		// check if next step already reached
			if (op_pt->amp > 1.0)
			{
				// attack phase finished, next: decay
				op_pt->op_state = OF_TYPE_DEC;
				op_pt->amp = 1.0;
				op_pt->step_amp = 1.0;
			}
			op_pt->step_skip_pos_a <<= 1;
			if (op_pt->step_skip_pos_a==0) op_pt->step_skip_pos_a = 1;
			if (op_pt->step_skip_pos_a & op_pt->env_step_skip_a)
			{	// check if required to skip next step
				op_pt->step_amp = op_pt->amp;
			}
		}
	}
	op_pt->generator_pos -= num_steps_add*FIXEDPT;
}